

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavFileWriter.h
# Opt level: O2

WavFileWriter * __thiscall
WavFileWriter::OpenWrite
          (WavFileWriter *this,AudioDescriptor *ADesc,char *file_root,SplitType_t split)

{
  Rational RVar1;
  Rational RVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ui32_t uVar9;
  WavFileElement *pWVar10;
  ILogSink *this_00;
  undefined4 in_register_0000000c;
  char *pcVar11;
  uint uVar12;
  undefined1 *puVar13;
  ui32_t in_R8D;
  uint uVar14;
  AudioDescriptor tmpDesc;
  SimpleRF64Header Wav;
  WavFileElement *local_508 [13];
  Result_t result;
  char filename [1024];
  
  pcVar11 = (char *)CONCAT44(in_register_0000000c,split);
  if (pcVar11 == (char *)0x0) {
    puVar13 = Kumu::RESULT_PTR;
LAB_0010a8aa:
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar13);
    return this;
  }
  if (*pcVar11 == '\0') {
    puVar13 = Kumu::RESULT_NULL_STR;
    goto LAB_0010a8aa;
  }
  Kumu::Result_t::Result_t(&result,(Result_t *)Kumu::RESULT_OK);
  RVar1 = *(Rational *)file_root;
  RVar2 = *(Rational *)(file_root + 8);
  uVar3 = *(undefined8 *)(file_root + 0x10);
  uVar4 = *(undefined8 *)(file_root + 0x18);
  uVar5 = *(undefined8 *)(file_root + 0x20);
  uVar6 = *(undefined8 *)(file_root + 0x28);
  ADesc->AvgBps = (int)uVar5;
  ADesc->LinkedTrackID = (int)((ulong)uVar5 >> 0x20);
  ADesc->ContainerDuration = (int)uVar6;
  ADesc->ChannelFormat = (int)((ulong)uVar6 >> 0x20);
  ADesc->Locked = (int)uVar3;
  ADesc->ChannelCount = (int)((ulong)uVar3 >> 0x20);
  ADesc->QuantizationBits = (int)uVar4;
  ADesc->BlockAlign = (int)((ulong)uVar4 >> 0x20);
  ADesc->EditRate = RVar1;
  ADesc->AudioSamplingRate = RVar2;
  if (in_R8D == 0) {
    uVar9 = ADesc->ChannelCount;
    ADesc[1].QuantizationBits = uVar9;
    if (uVar9 == 0) goto LAB_0010abac;
    uVar12 = 1;
  }
  else {
    if (in_R8D == 2) {
      if ((ADesc->ChannelCount & 1) != 0) {
        this_00 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error
                  (this_00,"Unable to create 2-channel splits with odd number of input channels.\n")
        ;
        Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PARAM);
        goto LAB_0010ab63;
      }
      uVar12 = ADesc->ChannelCount >> 1;
    }
    else {
      if (in_R8D != 1) goto LAB_0010abac;
      uVar12 = ADesc->ChannelCount;
    }
    ADesc[1].QuantizationBits = in_R8D;
    if (uVar12 == 0) {
LAB_0010abac:
      __assert_fail("file_count && m_ChannelCount",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/WavFileWriter.h"
                    ,0x89,
                    "ASDCP::Result_t WavFileWriter::OpenWrite(ASDCP::PCM::AudioDescriptor &, const char *, SplitType_t)"
                   );
    }
  }
  uVar9 = ASDCP::PCM::CalcFrameBufferSize(ADesc);
  if (in_R8D == 0) {
    snprintf(filename,0x400,"%s",pcVar11);
    pWVar10 = (WavFileElement *)operator_new(0x68);
    WavFileElement::WavFileElement(pWVar10,uVar9 / uVar12);
    local_508[0] = pWVar10;
    std::__cxx11::list<WavFileElement_*,_std::allocator<WavFileElement_*>_>::push_back
              ((list<WavFileElement_*,_std::allocator<WavFileElement_*>_> *)(ADesc + 1),local_508);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&tmpDesc,filename,(allocator<char> *)&Wav);
    Kumu::FileWriter::OpenWrite((string *)local_508);
    Kumu::Result_t::operator=(&result,(Result_t *)local_508);
    Kumu::Result_t::~Result_t((Result_t *)local_508);
    std::__cxx11::string::~string((string *)&tmpDesc);
    if (-1 < _result) {
      tmpDesc.EditRate = ADesc->EditRate;
      tmpDesc.AudioSamplingRate = ADesc->AudioSamplingRate;
      uVar8 = ADesc->Locked;
      tmpDesc.QuantizationBits = ADesc->QuantizationBits;
      tmpDesc.BlockAlign = ADesc->BlockAlign;
      tmpDesc.AvgBps = ADesc->AvgBps;
      tmpDesc.LinkedTrackID = ADesc->LinkedTrackID;
      tmpDesc.ContainerDuration = ADesc->ContainerDuration;
      tmpDesc.ChannelFormat = ADesc->ChannelFormat;
      tmpDesc.ChannelCount = ADesc[1].QuantizationBits;
      tmpDesc.Locked = uVar8;
      ASDCP::RF64::SimpleRF64Header::SimpleRF64Header(&Wav,&tmpDesc);
      ASDCP::RF64::SimpleRF64Header::WriteToFile((FileWriter *)local_508);
      Kumu::Result_t::operator=(&result,(Result_t *)local_508);
      Kumu::Result_t::~Result_t((Result_t *)local_508);
    }
  }
  else {
    uVar14 = 1;
    while ((uVar14 - 1 < uVar12 && (-1 < _result))) {
      snprintf(filename,0x400,"%s_%02u.wav",pcVar11,(ulong)uVar14);
      pWVar10 = (WavFileElement *)operator_new(0x68);
      WavFileElement::WavFileElement(pWVar10,uVar9 / uVar12);
      local_508[0] = pWVar10;
      std::__cxx11::list<WavFileElement_*,_std::allocator<WavFileElement_*>_>::push_back
                ((list<WavFileElement_*,_std::allocator<WavFileElement_*>_> *)(ADesc + 1),
                 (value_type *)local_508);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tmpDesc,filename,(allocator<char> *)&Wav);
      Kumu::FileWriter::OpenWrite((string *)local_508);
      Kumu::Result_t::operator=(&result,(Result_t *)local_508);
      Kumu::Result_t::~Result_t((Result_t *)local_508);
      std::__cxx11::string::~string((string *)&tmpDesc);
      if (-1 < _result) {
        tmpDesc.EditRate = ADesc->EditRate;
        tmpDesc.AudioSamplingRate = ADesc->AudioSamplingRate;
        uVar7 = ADesc->Locked;
        tmpDesc.QuantizationBits = ADesc->QuantizationBits;
        tmpDesc.BlockAlign = ADesc->BlockAlign;
        tmpDesc.AvgBps = ADesc->AvgBps;
        tmpDesc.LinkedTrackID = ADesc->LinkedTrackID;
        tmpDesc.ContainerDuration = ADesc->ContainerDuration;
        tmpDesc.ChannelFormat = ADesc->ChannelFormat;
        tmpDesc.ChannelCount = ADesc[1].QuantizationBits;
        tmpDesc.Locked = uVar7;
        ASDCP::RF64::SimpleRF64Header::SimpleRF64Header(&Wav,&tmpDesc);
        ASDCP::RF64::SimpleRF64Header::WriteToFile((FileWriter *)local_508);
        Kumu::Result_t::operator=(&result,(Result_t *)local_508);
        Kumu::Result_t::~Result_t((Result_t *)local_508);
      }
      uVar14 = uVar14 + 1;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,&result);
LAB_0010ab63:
  Kumu::Result_t::~Result_t(&result);
  return this;
}

Assistant:

ASDCP::Result_t
    OpenWrite(ASDCP::PCM::AudioDescriptor &ADesc, const char* file_root, SplitType_t split = ST_NONE)
    {
      ASDCP_TEST_NULL_STR(file_root);
      char filename[Kumu::MaxFilePath];
      ui32_t file_count = 0;
      ASDCP::Result_t result = ASDCP::RESULT_OK;
      m_ADesc = ADesc;

      switch ( split )
	{
	case ST_NONE:
	  file_count = 1;
	  m_ChannelCount = m_ADesc.ChannelCount;
	  break;

	case ST_MONO:
	  file_count = m_ADesc.ChannelCount;
	  m_ChannelCount = 1;
	  break;

	case ST_STEREO:
	  if ( m_ADesc.ChannelCount % 2 != 0 )
	    {
	      Kumu::DefaultLogSink().Error("Unable to create 2-channel splits with odd number of input channels.\n");
	      return ASDCP::RESULT_PARAM;
	    }

	  file_count = m_ADesc.ChannelCount / 2;
	  m_ChannelCount = 2;
	  break;
	}
      assert(file_count && m_ChannelCount);

      ui32_t element_size = ASDCP::PCM::CalcFrameBufferSize(m_ADesc) / file_count;
      if (split == ST_NONE)
      {
          snprintf(filename, Kumu::MaxFilePath, "%s", file_root);
          m_OutFile.push_back(new WavFileElement(element_size));
          result = m_OutFile.back()->OpenWrite(filename);
          if ( ASDCP_SUCCESS(result) )
          {
              ASDCP::PCM::AudioDescriptor tmpDesc = m_ADesc;
              tmpDesc.ChannelCount = m_ChannelCount;
              ASDCP::RF64::SimpleRF64Header Wav(tmpDesc);
              result = Wav.WriteToFile(*(m_OutFile.back()));
          }
      }
      else
      {
          for ( ui32_t i = 0; i < file_count && ASDCP_SUCCESS(result); i++ )
          {
              snprintf(filename, Kumu::MaxFilePath, "%s_%02u.wav", file_root, (i + 1));
              m_OutFile.push_back(new WavFileElement(element_size));
              result = m_OutFile.back()->OpenWrite(filename);

              if ( ASDCP_SUCCESS(result) )
              {
                  ASDCP::PCM::AudioDescriptor tmpDesc = m_ADesc;
                  tmpDesc.ChannelCount = m_ChannelCount;
                  ASDCP::RF64::SimpleRF64Header Wav(tmpDesc);
                  result = Wav.WriteToFile(*(m_OutFile.back()));
              }
          }
      }
      return result;
    }